

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O1

QMatchData * __thiscall
QMap<QString,_QMatchData>::take
          (QMatchData *__return_storage_ptr__,QMap<QString,_QMatchData> *this,QString *key)

{
  QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
  *pQVar1;
  Data *pDVar2;
  int *piVar3;
  qsizetype qVar4;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  QMap<QString,_QMatchData> copy;
  node_type local_58;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>_>
  local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
                 *)0x0) {
    (__return_storage_ptr__->indices).v = false;
    (__return_storage_ptr__->indices).vector.d.d = (Data *)0x0;
    (__return_storage_ptr__->indices).vector.d.ptr = (int *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->indices).vector.d.ptr + 4) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->indices).vector.d.size + 4) = 0;
    *(undefined8 *)&(__return_storage_ptr__->indices).t = 0xffffffffffffffff;
    __return_storage_ptr__->partial = false;
  }
  else {
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value == (__atomic_base<int>)0x1) {
      local_38.d.ptr =
           (totally_ordered_wrapper<QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>_*>
            )(QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
              *)0x0;
    }
    else {
      local_38.d.ptr =
           (totally_ordered_wrapper<QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>_*>
            )(this->d).d.ptr;
      if (local_38.d.ptr !=
          (QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
           *)0x0) {
        LOCK();
        (((QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
           *)local_38.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value =
             (Type)((int)(((QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
                            *)local_38.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                         super_QBasicAtomicInteger<int>._q_value + 1);
        UNLOCK();
      }
    }
    detach(this);
    local_58._M_pmapped =
         (__pointer<typename_pair<const_QString,_QMatchData>::second_type>)&DAT_aaaaaaaaaaaaaaaa;
    local_58.
    super__Node_handle_common<std::pair<const_QString,_QMatchData>,_std::allocator<std::_Rb_tree_node<std::pair<const_QString,_QMatchData>_>_>_>
    ._M_ptr = (pointer)&DAT_aaaaaaaaaaaaaaaa;
    local_58._M_pkey = (__pointer<QString>)&DAT_aaaaaaaaaaaaaaaa;
    std::
    _Rb_tree<QString,_std::pair<const_QString,_QMatchData>,_std::_Select1st<std::pair<const_QString,_QMatchData>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>
    ::extract(&local_58,&(((this->d).d.ptr)->m)._M_t,key);
    if (local_58.
        super__Node_handle_common<std::pair<const_QString,_QMatchData>,_std::allocator<std::_Rb_tree_node<std::pair<const_QString,_QMatchData>_>_>_>
        ._M_ptr == (pointer)0x0) {
      std::
      _Node_handle_common<std::pair<const_QString,_QMatchData>,_std::allocator<std::_Rb_tree_node<std::pair<const_QString,_QMatchData>_>_>_>
      ::~_Node_handle_common
                (&local_58.
                  super__Node_handle_common<std::pair<const_QString,_QMatchData>,_std::allocator<std::_Rb_tree_node<std::pair<const_QString,_QMatchData>_>_>_>
                );
      (__return_storage_ptr__->indices).v = false;
      (__return_storage_ptr__->indices).vector.d.d = (Data *)0x0;
      (__return_storage_ptr__->indices).vector.d.ptr = (int *)0x0;
      *(undefined8 *)((long)&(__return_storage_ptr__->indices).vector.d.ptr + 4) = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->indices).vector.d.size + 4) = 0;
      *(undefined8 *)&(__return_storage_ptr__->indices).t = 0xffffffffffffffff;
      __return_storage_ptr__->partial = false;
    }
    else {
      (__return_storage_ptr__->indices).v = ((local_58._M_pmapped)->indices).v;
      pDVar2 = ((local_58._M_pmapped)->indices).vector.d.d;
      piVar3 = ((local_58._M_pmapped)->indices).vector.d.ptr;
      ((local_58._M_pmapped)->indices).vector.d.d = (Data *)0x0;
      ((local_58._M_pmapped)->indices).vector.d.ptr = (int *)0x0;
      (__return_storage_ptr__->indices).vector.d.d = pDVar2;
      (__return_storage_ptr__->indices).vector.d.ptr = piVar3;
      qVar4 = ((local_58._M_pmapped)->indices).vector.d.size;
      iVar5 = ((local_58._M_pmapped)->indices).f;
      iVar6 = ((local_58._M_pmapped)->indices).t;
      ((local_58._M_pmapped)->indices).vector.d.size = 0;
      (__return_storage_ptr__->indices).vector.d.size = qVar4;
      (__return_storage_ptr__->indices).f = iVar5;
      (__return_storage_ptr__->indices).t = iVar6;
      __return_storage_ptr__->exactMatchIndex = (local_58._M_pmapped)->exactMatchIndex;
      __return_storage_ptr__->partial = (local_58._M_pmapped)->partial;
      std::
      _Node_handle_common<std::pair<const_QString,_QMatchData>,_std::allocator<std::_Rb_tree_node<std::pair<const_QString,_QMatchData>_>_>_>
      ::~_Node_handle_common
                (&local_58.
                  super__Node_handle_common<std::pair<const_QString,_QMatchData>,_std::allocator<std::_Rb_tree_node<std::pair<const_QString,_QMatchData>_>_>_>
                );
    }
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

T take(const Key &key)
    {
        if (!d)
            return T();

        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        // TODO: improve. There is no need of copying all the
        // elements (the one to be removed can be skipped).
        detach();

#ifdef __cpp_lib_node_extract
        if (const auto node = d->m.extract(key))
            return std::move(node.mapped());
#else
        auto i = d->m.find(key);
        if (i != d->m.end()) {
            // ### breaks RVO on most compilers (but only on old-fashioned ones, so who cares?)
            T result(std::move(i->second));
            d->m.erase(i);
            return result;
        }
#endif
        return T();
    }